

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psubush_mips64(uint64_t fs,uint64_t ft)

{
  short *psVar1;
  long lVar2;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar2 = 0;
  do {
    psVar1 = (short *)((long)&vs + lVar2 * 2);
    *psVar1 = *psVar1 - *(short *)((long)&vt + lVar2 * 2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_psubush(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.uh[i] - vt.uh[i];
        vs.uh[i] = SATUH(r);
    }
    return vs.d;
}